

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

void Gudhi::persistence_matrix::swap
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
                *col1,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
                      *col2)

{
  Field_operators *pFVar1;
  Entry_constructor *pEVar2;
  
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&col1->column_,(node_ptr)&col2->column_);
  pFVar1 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar1;
  pEVar2 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar2;
  return;
}

Assistant:

void swap(Intrusive_list_column& col1, Intrusive_list_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }